

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  MSize n;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  if ((ctx->sb).sz < (ctx->sb).n + 0xb) {
    bcwrite_resize(ctx,0xb);
  }
  uVar6 = (o->field_2).it;
  if (uVar6 == 0xfffffffb) {
    uVar6 = (o->u32).lo;
    uVar5 = *(uint *)((ulong)uVar6 + 0xc);
    uVar4 = (ctx->sb).n;
    uVar10 = uVar5 + 5;
    if ((ctx->sb).sz < uVar4 + uVar5 + 5) {
      bcwrite_resize(ctx,uVar10);
      uVar4 = (ctx->sb).n;
    }
    pcVar2 = (ctx->sb).buf;
    uVar9 = uVar10;
    if (0x7f < uVar10) {
      do {
        uVar7 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        pcVar2[uVar7] = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        bVar3 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar3);
    }
    pcVar2[uVar4] = (char)uVar9;
    pcVar2 = (ctx->sb).buf;
    (ctx->sb).n = uVar4 + uVar5 + 1;
    if ((ulong)uVar5 != 0) {
      uVar7 = 0;
      do {
        pcVar2[uVar7 + (uVar4 + 1)] = *(char *)((ulong)uVar6 + 0x10 + uVar7);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
  }
  else if (uVar6 < 0xfffeffff) {
    if (narrow == 0) {
      uVar7 = (ulong)(ctx->sb).n;
    }
    else {
      dVar1 = o->n;
      uVar6 = (ctx->sb).n;
      uVar7 = (ulong)uVar6;
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        uVar5 = (uint)dVar1;
        (ctx->sb).n = uVar6 + 1;
        (ctx->sb).buf[uVar7] = '\x03';
        uVar6 = (ctx->sb).n;
        pcVar2 = (ctx->sb).buf;
        uVar7 = (ulong)uVar6;
        if (0x7f < uVar5) {
          do {
            iVar8 = (int)uVar7;
            uVar4 = iVar8 + 1;
            pcVar2[uVar7] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            bVar3 = 0x3fff < uVar5;
            uVar7 = (ulong)uVar4;
            uVar5 = uVar6;
          } while (bVar3);
          pcVar2[uVar4] = (char)uVar6;
          (ctx->sb).n = iVar8 + 2;
          return;
        }
        pcVar2[uVar6] = (char)uVar5;
        (ctx->sb).n = uVar6 + 1;
        return;
      }
    }
    (ctx->sb).n = (int)uVar7 + 1;
    (ctx->sb).buf[uVar7] = '\x04';
    uVar6 = (o->u32).lo;
    uVar5 = (ctx->sb).n;
    pcVar2 = (ctx->sb).buf;
    uVar4 = uVar6;
    if (0x7f < uVar6) {
      do {
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        pcVar2[uVar7] = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar3);
    }
    uVar10 = uVar5 + 1;
    pcVar2[uVar5] = (char)uVar4;
    (ctx->sb).n = uVar10;
    uVar6 = (o->field_2).it;
    pcVar2 = (ctx->sb).buf;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        uVar7 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        pcVar2[uVar7] = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar3);
    }
    pcVar2[uVar10] = (char)uVar5;
    (ctx->sb).n = uVar10 + 1;
  }
  else {
    uVar5 = (ctx->sb).n;
    (ctx->sb).n = uVar5 + 1;
    (ctx->sb).buf[uVar5] = ~(byte)uVar6;
  }
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  bcwrite_need(ctx, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    bcwrite_need(ctx, 5+len);
    bcwrite_uleb128(ctx, BCDUMP_KTAB_STR+len);
    bcwrite_block(ctx, strdata(str), len);
  } else if (tvisint(o)) {
    bcwrite_byte(ctx, BCDUMP_KTAB_INT);
    bcwrite_uleb128(ctx, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	bcwrite_byte(ctx, BCDUMP_KTAB_INT);
	bcwrite_uleb128(ctx, k);
	return;
      }
    }
    bcwrite_byte(ctx, BCDUMP_KTAB_NUM);
    bcwrite_uleb128(ctx, o->u32.lo);
    bcwrite_uleb128(ctx, o->u32.hi);
  } else {
    lua_assert(tvispri(o));
    bcwrite_byte(ctx, BCDUMP_KTAB_NIL+~itype(o));
  }
}